

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O0

void __thiscall helics::tcp::TcpComms::queue_tx_function(TcpComms *this)

{
  string_view message;
  bool bVar1;
  __int_type_conflict _Var2;
  int32_t val;
  ConnectionStatus CVar3;
  string *connection;
  element_type *peVar4;
  _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  in_RCX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int __fd;
  _Self *__y;
  long in_RDI;
  undefined1 *in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>,_bool>
  pVar6;
  pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_> *rt;
  iterator __end2;
  iterator __begin2;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  *__range2;
  system_error *se_2;
  system_error *se_1;
  iterator rt_find;
  system_error *se;
  exception *e;
  pointer new_connect;
  string port;
  string interface;
  string newroute;
  bool processed;
  ActionMessage cmd;
  route_id rid;
  bool processing;
  ActionMessage m_1;
  ActionMessage m;
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  routes;
  pointer brokerConnection;
  LoopHandle contextLoop;
  SocketFactory sf;
  shared_ptr<gmlc::networking::AsioContextManager> ioctx;
  undefined4 in_stack_fffffffffffff658;
  int32_t in_stack_fffffffffffff65c;
  ActionMessage *in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff668;
  ConnectionStatus in_stack_fffffffffffff66c;
  CommsInterface *in_stack_fffffffffffff670;
  action_t in_stack_fffffffffffff67c;
  ActionMessage *in_stack_fffffffffffff680;
  ActionMessage *in_stack_fffffffffffff688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff690;
  ActionMessage *in_stack_fffffffffffff698;
  element_type *in_stack_fffffffffffff6a0;
  undefined1 in_stack_fffffffffffff6b7;
  string *in_stack_fffffffffffff6b8;
  SocketFactory *in_stack_fffffffffffff6c0;
  element_type *in_stack_fffffffffffff6c8;
  CommsInterface *in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d8;
  int32_t in_stack_fffffffffffff6dc;
  char *in_stack_fffffffffffff6e0;
  string *in_stack_fffffffffffff6e8;
  undefined1 *bufferSize;
  string *port_00;
  io_context *io_context;
  char *in_stack_fffffffffffff728;
  size_t in_stack_fffffffffffff730;
  _Self local_8a0;
  _Self local_898;
  undefined1 *local_890;
  allocator<char> local_861 [73];
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff848;
  undefined1 local_740 [96];
  ActionMessage *in_stack_fffffffffffff920;
  undefined1 local_650 [32];
  _Self local_630;
  _Self local_628;
  undefined4 local_620;
  undefined1 local_570 [36];
  undefined4 local_54c;
  _Base_ptr local_4a8;
  undefined1 local_4a0;
  route_id local_494 [5];
  undefined1 local_480 [16];
  string local_470 [2];
  undefined1 local_430 [71];
  undefined1 local_3e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8 [3];
  atomic<helics::CommsInterface::ConnectionStatus> local_3b8;
  byte local_3b1;
  int local_2dc;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  route_id local_228;
  byte local_221;
  undefined4 local_21c;
  undefined4 local_164;
  undefined4 local_15c;
  undefined1 local_a8 [72];
  undefined1 local_60 [96];
  
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff670);
  gmlc::networking::AsioContextManager::getContextPointer(in_stack_fffffffffffff6e8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff660);
  if ((*(byte *)(in_RDI + 0x41c) & 1) == 0) {
    memset(local_60,0,0x18);
    gmlc::networking::SocketFactory::SocketFactory((SocketFactory *)in_stack_fffffffffffff660);
  }
  else {
    gmlc::networking::SocketFactory::SocketFactory
              (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,(bool)in_stack_fffffffffffff6b7);
  }
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x40034c);
  gmlc::networking::AsioContextManager::startContextLoop(local_861._73_8_);
  std::shared_ptr<gmlc::networking::TcpConnection>::shared_ptr
            ((shared_ptr<gmlc::networking::TcpConnection> *)0x40036b);
  std::
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::map((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
         *)0x400378);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40038c);
  if (!bVar1) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_fffffffffffff660,
               SUB41((uint)in_stack_fffffffffffff65c >> 0x18,0));
  }
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
  if (bVar1) {
    bVar1 = establishBrokerConnection
                      ((TcpComms *)in_stack_fffffffffffffdb8,
                       (shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_fffffffffffffdb0
                       ,(shared_ptr<gmlc::networking::TcpConnection> *)in_stack_fffffffffffffda8);
    if (!bVar1) {
      ActionMessage::ActionMessage(in_stack_fffffffffffff680,in_stack_fffffffffffff67c);
      local_15c = 0x16570bf;
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      local_164 = 1;
      ActionMessage::~ActionMessage(in_stack_fffffffffffff660);
      goto LAB_004019db;
    }
  }
  else {
    _Var2 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    if (_Var2 < 0) {
      getDefaultBrokerPort((TcpComms *)0x40051f);
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668)
                 ,(__int_type_conflict)((ulong)in_stack_fffffffffffff660 >> 0x20));
      ActionMessage::ActionMessage(in_stack_fffffffffffff680,in_stack_fffffffffffff67c);
      local_21c = 0x5ab;
      std::__atomic_base::operator_cast_to_int
                ((__atomic_base<int> *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668)
                );
      ActionMessage::setExtraData(in_stack_fffffffffffff660,in_stack_fffffffffffff65c);
      gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
                 in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      ActionMessage::~ActionMessage(in_stack_fffffffffffff660);
    }
  }
  CommsInterface::setTxStatus(in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
  aVar5._8_8_ = in_stack_fffffffffffff728;
  aVar5._M_allocated_capacity = in_stack_fffffffffffff730;
  local_221 = 1;
  while ((local_221 & 1) != 0) {
    route_id::route_id(&local_228);
    ActionMessage::ActionMessage((ActionMessage *)in_stack_fffffffffffff670);
    gmlc::containers::
    BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
    ::pop(in_stack_fffffffffffff848);
    std::tie<helics::route_id,helics::ActionMessage>
              ((route_id *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
               in_stack_fffffffffffff660);
    std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
              ((tuple<helics::route_id_&,_helics::ActionMessage_&> *)in_stack_fffffffffffff670,
               (pair<helics::route_id,_helics::ActionMessage> *)
               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
    std::pair<helics::route_id,_helics::ActionMessage>::~pair
              ((pair<helics::route_id,_helics::ActionMessage> *)0x40067a);
    local_3b1 = 0;
    bVar1 = isProtocolCommand(in_stack_fffffffffffff660);
    if (bVar1) {
      local_3b8._M_i = STARTUP;
      bVar1 = route_id::operator==(&local_228,(route_id)0xffffffff);
      if (bVar1) {
        if (local_2dc == 0xe9) {
          aVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   )SmallBuffer::to_string((SmallBuffer *)0x40073e);
          io_context = (io_context *)&local_3e9;
          local_3e8[0] = aVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff6a0,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff698,
                     (allocator<char> *)in_stack_fffffffffffff690);
          std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff670);
          std::__cxx11::string::string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff670);
          gmlc::networking::extractInterfaceAndPortString((string *)in_stack_fffffffffffff6c8);
          bufferSize = local_480;
          std::tie<std::__cxx11::string,std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff660);
          port_00 = local_470;
          std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)in_stack_fffffffffffff670,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
          CLI::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff660);
          std::
          __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x40083e);
          connection = (string *)
                       gmlc::networking::AsioContextManager::getBaseContext
                                 ((AsioContextManager *)0x400846);
          in_R8 = local_430;
          gmlc::networking::TcpConnection::create
                    (aVar5._8_8_,io_context,connection,port_00,(size_t)bufferSize);
          val = ActionMessage::getExtraData((ActionMessage *)0x400892);
          route_id::route_id(local_494,val);
          pVar6 = std::
                  map<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<gmlc::networking::TcpConnection>>>>
                  ::emplace<helics::route_id,std::shared_ptr<gmlc::networking::TcpConnection>>
                            ((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                              *)in_stack_fffffffffffff670,
                             (route_id *)
                             CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668),
                             (shared_ptr<gmlc::networking::TcpConnection> *)
                             in_stack_fffffffffffff660);
          in_RCX = pVar6.first._M_node;
          local_4a0 = pVar6.second;
          local_4a8 = in_RCX._M_node;
          std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
                    ((shared_ptr<gmlc::networking::TcpConnection> *)0x400910);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff660);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff660);
          local_3b1 = 1;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff660);
        }
        else if (local_2dc == 0xf4) {
          in_stack_fffffffffffff6dc = ActionMessage::getExtraData((ActionMessage *)0x400bf8);
          in_stack_fffffffffffff6d0 = (CommsInterface *)&stack0xfffffffffffffab8;
          route_id::route_id((route_id *)in_stack_fffffffffffff6d0,in_stack_fffffffffffff6dc);
          std::
          map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
          ::erase((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                   *)in_stack_fffffffffffff660,
                  (key_type *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          local_3b1 = 1;
        }
        else if (local_2dc == 0x9db) {
          local_221 = 0;
          local_3b1 = 1;
        }
        else if (local_2dc == 0x16570bf) {
          gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>
          ::push<helics::ActionMessage&>
                    ((BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
                     in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
          local_3b1 = 1;
        }
      }
    }
    if ((local_3b1 & 1) == 0) {
      local_54c = 0;
      bVar1 = route_id::operator==(&local_228,(route_id)0x0);
      if (bVar1) {
        bVar1 = std::atomic::operator_cast_to_bool
                          ((atomic<bool> *)
                           CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        if (bVar1) {
          in_stack_fffffffffffff6c8 =
               std::
               __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x400ce2);
          ActionMessage::packetize_abi_cxx11_(in_stack_fffffffffffff688);
          gmlc::networking::TcpConnection::send
                    (in_stack_fffffffffffff6c8,(int)local_570,__buf,(size_t)in_RCX._M_node,
                     (int)in_R8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff660);
        }
      }
      else {
        local_620 = 0xffffffff;
        bVar1 = route_id::operator==(&local_228,(route_id)0xffffffff);
        if (bVar1) {
          gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>
          ::push<helics::ActionMessage&>
                    ((BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
                     in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
        }
        else {
          local_628._M_node =
               (_Base_ptr)
               std::
               map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
               ::find((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658),
                      (key_type *)0x401034);
          local_630._M_node =
               (_Base_ptr)
               std::
               map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
               ::end((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
          bVar1 = std::operator==(&local_628,&local_630);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            bVar1 = std::atomic::operator_cast_to_bool
                              ((atomic<bool> *)
                               CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
            if (bVar1) {
              peVar4 = std::
                       __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x4013f4);
              ActionMessage::packetize_abi_cxx11_(in_stack_fffffffffffff688);
              gmlc::networking::TcpConnection::send
                        (peVar4,(int)local_740,__buf_01,(size_t)in_RCX._M_node,(int)in_R8);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff660);
            }
            else {
              bVar1 = isDisconnectCommand((ActionMessage *)
                                          CONCAT44(in_stack_fffffffffffff66c,
                                                   in_stack_fffffffffffff668));
              if (!bVar1) {
                in_stack_fffffffffffff660 = (ActionMessage *)local_861;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff6a0,(char *)in_stack_fffffffffffff698,
                           (allocator<char> *)in_stack_fffffffffffff690);
                prettyPrintString_abi_cxx11_(in_stack_fffffffffffff920);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff698,in_stack_fffffffffffff690);
                join_0x00000010_0x00000000_ =
                     std::__cxx11::string::operator_cast_to_basic_string_view
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff660);
                message._M_len._4_4_ = in_stack_fffffffffffff6dc;
                message._M_len._0_4_ = in_stack_fffffffffffff6d8;
                message._M_str = in_stack_fffffffffffff6e0;
                CommsInterface::logWarning(in_stack_fffffffffffff6d0,message);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff660);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff660);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff660);
                std::allocator<char>::~allocator(local_861);
              }
            }
          }
          else {
            std::
            _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
            ::operator->((_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                          *)0x40108a);
            in_stack_fffffffffffff6a0 =
                 std::
                 __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x401096);
            ActionMessage::packetize_abi_cxx11_(in_stack_fffffffffffff688);
            gmlc::networking::TcpConnection::send
                      (in_stack_fffffffffffff6a0,(int)local_650,__buf_00,(size_t)in_RCX._M_node,
                       (int)in_R8);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff660);
          }
        }
      }
      local_164 = 0;
    }
    else {
      local_164 = 2;
    }
    ActionMessage::~ActionMessage(in_stack_fffffffffffff660);
  }
  local_890 = local_a8;
  local_898._M_node =
       (_Base_ptr)
       std::
       map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
       ::begin((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
  local_8a0._M_node =
       (_Base_ptr)
       std::
       map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
       ::end((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff65c,in_stack_fffffffffffff658));
  while( true ) {
    __y = &local_8a0;
    bVar1 = std::operator==(&local_898,__y);
    __fd = (int)__y;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                 *)0x40194e);
    peVar4 = std::
             __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x401967);
    gmlc::networking::TcpConnection::close(peVar4,__fd);
    std::
    _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                  *)in_stack_fffffffffffff660);
  }
  std::
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::clear((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
           *)0x40198f);
  CVar3 = CommsInterface::getRxStatus((CommsInterface *)0x40199c);
  if (CVar3 == CONNECTED) {
    closeReceiver((TcpComms *)aVar5._M_allocated_capacity);
  }
  CommsInterface::setTxStatus(in_stack_fffffffffffff670,in_stack_fffffffffffff66c);
  local_164 = 0;
LAB_004019db:
  std::
  map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
  ::~map((map<helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
          *)0x4019e8);
  std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
            ((shared_ptr<gmlc::networking::TcpConnection> *)0x4019f5);
  std::
  unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
  ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                 *)in_stack_fffffffffffff670);
  gmlc::networking::SocketFactory::~SocketFactory((SocketFactory *)0x401a0f);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x401a1c);
  return;
}

Assistant:

void TcpComms::queue_tx_function()
{
    // std::vector<char> buffer;
    auto ioctx = gmlc::networking::AsioContextManager::getContextPointer();
    auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                          gmlc::networking::SocketFactory();
    auto contextLoop = ioctx->startContextLoop();
    TcpConnection::pointer brokerConnection;

    std::map<route_id, TcpConnection::pointer> routes;  // for all the other possible routes
    if (!brokerTargetAddress.empty()) {
        hasBroker = true;
    }
    if (hasBroker) {
        if (!establishBrokerConnection(ioctx, brokerConnection)) {
            ActionMessage m(CMD_PROTOCOL);
            m.messageID = CLOSE_RECEIVER;
            rxMessageQueue.push(m);
            return;
        }
    } else {
        if (PortNumber < 0) {
            PortNumber = getDefaultBrokerPort();
            ActionMessage m(CMD_PROTOCOL);
            m.messageID = PORT_DEFINITIONS;
            m.setExtraData(PortNumber);
            rxMessageQueue.push(m);
        }
    }
    setTxStatus(ConnectionStatus::CONNECTED);

    //  std::vector<ActionMessage> txlist;
    bool processing{true};
    while (processing) {
        route_id rid;
        ActionMessage cmd;

        std::tie(rid, cmd) = txQueue.pop();
        bool processed = false;
        if (isProtocolCommand(cmd)) {
            if (rid == control_route) {
                switch (cmd.messageID) {
                    case NEW_ROUTE: {
                        std::string newroute(cmd.payload.to_string());

                        try {
                            std::string interface;
                            std::string port;
                            std::tie(interface, port) =
                                gmlc::networking::extractInterfaceAndPortString(newroute);
                            auto new_connect =
                                TcpConnection::create(sf, ioctx->getBaseContext(), interface, port);

                            routes.emplace(route_id{cmd.getExtraData()}, std::move(new_connect));
                        }
                        catch (std::exception& e) {
                            logWarning(std::string("unable to create route ") + newroute +
                                       "::" + e.what());
                        }
                        processed = true;
                    } break;
                    case REMOVE_ROUTE:
                        routes.erase(route_id{cmd.getExtraData()});
                        processed = true;
                        break;
                    case CLOSE_RECEIVER:
                        rxMessageQueue.push(cmd);
                        processed = true;
                        break;
                    case DISCONNECT:
                        processing = false;
                        processed = true;
                        break;
                }
            }
        }
        if (processed) {
            continue;
        }

        if (rid == parent_route_id) {
            if (hasBroker) {
                try {
                    brokerConnection->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("broker send 0 ") +
                                     actionMessageType(cmd.action()) + ':' + se.what());
                        }
                    }
                }

                // if (error)
                {
                    //     std::cerr << "transmit failure to broker " << error.message() <<
                    //     '\n';
                }
            }
        } else if (rid == control_route) {  // send to rx thread loop
            rxMessageQueue.push(cmd);
        } else {
            //  txlist.push_back(cmd);
            auto rt_find = routes.find(rid);
            if (rt_find != routes.end()) {
                try {
                    rt_find->second->send(cmd.packetize());
                }
                catch (const std::system_error& se) {
                    if (se.code() != asio::error::connection_aborted) {
                        if (!isDisconnectCommand(cmd)) {
                            logError(std::string("rt send ") + std::to_string(rid.baseValue()) +
                                     "::" + se.what());
                        }
                    }
                }
            } else {
                if (hasBroker) {
                    try {
                        brokerConnection->send(cmd.packetize());
                    }
                    catch (const std::system_error& se) {
                        if (se.code() != asio::error::connection_aborted) {
                            if (!isDisconnectCommand(cmd)) {
                                logError(std::string("broker send") +
                                         std::to_string(rid.baseValue()) + " ::" + se.what());
                            }
                        }
                    }
                } else {
                    if (!isDisconnectCommand(cmd)) {
                        logWarning(
                            std::string("(tcp) unknown message destination message dropped ") +
                            prettyPrintString(cmd));
                    }
                }
            }
        }
    }
    for (auto& rt : routes) {
        rt.second->close();
    }
    routes.clear();
    if (getRxStatus() == ConnectionStatus::CONNECTED) {
        closeReceiver();
    }
    setTxStatus(ConnectionStatus::TERMINATED);
}